

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOStreamBuffer.h
# Opt level: O2

int __thiscall
Assimp::IOStreamBuffer<char>::open(IOStreamBuffer<char> *this,char *__file,int __oflag,...)

{
  int iVar1;
  ulong uVar2;
  size_t sVar3;
  ulong uVar4;
  
  iVar1 = 0;
  if ((__file != (char *)0x0) && (this->m_stream == (IOStream *)0x0)) {
    this->m_stream = (IOStream *)__file;
    uVar2 = (**(code **)(*(long *)__file + 0x30))(__file,__file,___oflag);
    this->m_filesize = uVar2;
    if (uVar2 == 0) {
      iVar1 = 0;
    }
    else {
      uVar4 = this->m_cacheSize;
      if (uVar2 < this->m_cacheSize) {
        this->m_cacheSize = uVar2;
        uVar4 = uVar2;
      }
      sVar3 = (uVar2 / uVar4 + 1) - (ulong)(uVar2 % uVar4 == 0);
      this->m_numBlocks = sVar3;
      iVar1 = (int)CONCAT71((int7)(sVar3 >> 8),1);
    }
  }
  return iVar1;
}

Assistant:

AI_FORCE_INLINE
bool IOStreamBuffer<T>::open( IOStream *stream ) {
    //  file still opened!
    if ( nullptr != m_stream ) {
        return false;
    }

    //  Invalid stream pointer
    if ( nullptr == stream ) {
        return false;
    }

    m_stream = stream;
    m_filesize = m_stream->FileSize();
    if ( m_filesize == 0 ) {
        return false;
    }
    if ( m_filesize < m_cacheSize ) {
        m_cacheSize = m_filesize;
    }

    m_numBlocks = m_filesize / m_cacheSize;
    if ( ( m_filesize % m_cacheSize ) > 0 ) {
        m_numBlocks++;
    }

    return true;
}